

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_MutAlgebraicCon_Test::TestBody(ProblemTest_MutAlgebraicCon_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  iterator this_00;
  pointer pTVar4;
  char *pcVar5;
  MutAlgebraicCon MVar6;
  AlgebraicCon AVar7;
  AlgebraicCon ccon;
  Problem *cp;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  int i;
  const_iterator it;
  AssertionResult gtest_ar_6;
  int num_terms;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  double coefs [1];
  int indices [1];
  AssertionResult gtest_ar_3;
  NumericConstant expr;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  MutAlgebraicCon con;
  AssertionResult gtest_ar;
  Problem p;
  undefined4 in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff89c;
  MutAlgebraicCon *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  ExprBase in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff8c4;
  undefined8 in_stack_fffffffffffff8c8;
  Type type;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  undefined4 in_stack_fffffffffffff918;
  int in_stack_fffffffffffff91c;
  AssertHelper *in_stack_fffffffffffff920;
  double in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff960;
  AssertionResult local_5a8 [2];
  Term *local_588;
  AssertionResult local_580 [2];
  double local_560;
  AssertionResult local_558 [2];
  int local_534;
  AssertionResult local_530;
  int local_51c;
  Term *local_518;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_510 [3];
  int local_4f4;
  AssertionResult local_4f0;
  int local_4dc;
  double local_4c8;
  undefined8 local_4c0;
  AssertionResult local_4b8 [2];
  double local_498;
  undefined8 local_490;
  AssertionResult local_488;
  undefined8 local_478;
  undefined4 local_46c;
  ExprBase local_458;
  AssertionResult local_450;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_440;
  Impl *local_430;
  double local_418;
  undefined8 local_410;
  AssertionResult local_408 [2];
  double local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3c8;
  int local_3c0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3b8;
  int local_3b0;
  int local_398;
  undefined4 local_394;
  AssertionResult local_390;
  BasicProblem<mp::BasicProblemParams<int>_> *local_380;
  int local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffff960,
                     (double)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
                     in_stack_fffffffffffff950);
  local_380 = MVar6.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_378 = MVar6.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_394 = 1;
  local_398 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_algebraic_cons
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12439e);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x1244ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124503);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffff8b0.impl_,
                     in_stack_fffffffffffff8ac);
  local_3c8 = MVar6.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c0 = MVar6.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3dc = 0;
  local_3b8 = local_3c8;
  local_3b0 = local_3c0;
  local_3e8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::dual((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)in_stack_fffffffffffff8b0.impl_);
  testing::internal::EqHelper<true>::Compare<int,double>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (double *)in_stack_fffffffffffff8a0,
             (type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124635);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1246f0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_dual
            (in_stack_fffffffffffff8a0,
             (double)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_410 = 0x4010cccccccccccd;
  local_418 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::dual((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)in_stack_fffffffffffff8b0.impl_);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (double *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (double *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1247df);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124842);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12489a);
  local_440.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                  (double)in_stack_fffffffffffff8a0);
  local_430 = (Impl *)local_440.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (NumericConstant)in_stack_fffffffffffff8b0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (NumericExpr)in_stack_fffffffffffff8b0.impl_);
  local_458.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::nonlinear_expr((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  testing::internal::EqHelper<false>::
  Compare<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (NumericConstant *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1249cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124a2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124a87);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
            ((MutAlgebraicCon *)0x124a94);
  mp::LinearExpr::AddTerm
            ((LinearExpr *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
             (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(double)in_stack_fffffffffffff8b0.impl_
            );
  local_46c = 0xb;
  local_478 = 0x400199999999999a;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_lb
            (in_stack_fffffffffffff8a0,
             (double)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_ub
            (in_stack_fffffffffffff8a0,
             (double)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_490 = 0x400a666666666666;
  local_498 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::lb((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    *)0x124b19);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (double *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (double *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124bd2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124c35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124c8d);
  local_4c0 = 0x401199999999999a;
  local_4c8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::ub((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    *)0x124cac);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (double *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (double *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124d65);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124e20);
  local_4dc = 1;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
            ((MutAlgebraicCon *)0x124e38);
  local_4f4 = mp::LinearExpr::num_terms((LinearExpr *)0x124e40);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x124ef3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x124f56);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124fae);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
            ((MutAlgebraicCon *)0x124fbb);
  this_00 = mp::LinearExpr::begin
                      ((LinearExpr *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_518 = this_00.m_ptr;
  gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::
  small_vector_iterator<mp::LinearExpr::Term_*,_long,_nullptr>
            ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)in_stack_fffffffffffff8a0,
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_51c = 0;
  while (type = (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20), local_51c < local_4dc) {
    pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x125033);
    in_stack_fffffffffffff91c = mp::LinearExpr::Term::var_index(pTVar4);
    local_534 = in_stack_fffffffffffff91c;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
               (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)in_stack_fffffffffffff8a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_530);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x1250e5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                 (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                 (char *)in_stack_fffffffffffff8b0.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00.m_ptr,
                 (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
      testing::Message::~Message((Message *)0x125142);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12519a);
    pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1251bc);
    local_560 = mp::LinearExpr::Term::coef(pTVar4);
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
               (double *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (double *)in_stack_fffffffffffff8a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_558);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x12526e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                 (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                 (char *)in_stack_fffffffffffff8b0.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00.m_ptr,
                 (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
      testing::Message::~Message((Message *)0x1252cb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x125320);
    local_51c = local_51c + 1;
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(local_510);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
            ((MutAlgebraicCon *)0x125362);
  local_588 = (Term *)mp::LinearExpr::end((LinearExpr *)
                                          CONCAT44(in_stack_fffffffffffff89c,
                                                   in_stack_fffffffffffff898));
  testing::internal::EqHelper<false>::
  Compare<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)
             CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)in_stack_fffffffffffff8a0)
  ;
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_580);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff8d0));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x125402);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8d0),type,
               (char *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.m_ptr,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x12545f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1254b7);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
            ((MutAlgebraicCon *)0x1254cf);
  iVar3 = mp::LinearExpr::num_terms((LinearExpr *)0x1254d7);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a8);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8c0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff8d0));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x12557e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8d0),type,
               (char *)CONCAT44(iVar3,uVar8),(int)((ulong)pcVar5 >> 0x20),
               (char *)in_stack_fffffffffffff8b0.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.m_ptr,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0x1255db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125633);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
            ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffff8b0.impl_,
             in_stack_fffffffffffff8ac);
  AVar7 = mp::BasicProblem::MutAlgebraicCon::operator_cast_to_BasicAlgebraicCon
                    ((MutAlgebraicCon *)0x1256a0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            (AVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
             problem_);
  return;
}

Assistant:

TEST(ProblemTest, MutAlgebraicCon) {
  Problem p;
  p.AddCon(0, 0);
  EXPECT_EQ(1, p.num_algebraic_cons());
  Problem::MutAlgebraicCon con = p.algebraic_con(0);
  EXPECT_EQ(0, con.dual());
  con.set_dual(4.2);
  EXPECT_EQ(4.2 , con.dual());
  auto expr = p.MakeNumericConstant(42);
  con.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, con.nonlinear_expr());
  con.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  con.set_lb(3.3);
  con.set_ub(4.4);
  EXPECT_EQ(3.3, con.lb());
  EXPECT_EQ(4.4, con.ub());
  EXPECT_LINEAR_EXPR(con.linear_expr(), indices, coefs);
  EXPECT_EQ(1, con.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::AlgebraicCon ccon = cp.algebraic_con(0);
  ccon = con;
}